

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O0

void __thiscall ON_RenderChannels::ON_RenderChannels(ON_RenderChannels *this,ON_RenderChannels *rch)

{
  CImpl *this_00;
  ON_RenderChannels *rch_local;
  ON_RenderChannels *this_local;
  
  this->_vptr_ON_RenderChannels = (_func_int **)&PTR__ON_RenderChannels_00b77740;
  this_00 = (CImpl *)operator_new(0x40);
  CImpl::CImpl(this_00);
  this->m_impl = this_00;
  (*this->_vptr_ON_RenderChannels[2])(this,rch);
  return;
}

Assistant:

ON_RenderChannels::ON_RenderChannels(const ON_RenderChannels& rch)
{
  m_impl = new CImpl;
  operator = (rch);
}